

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool QDir::match(QStringList *filters,QString *fileName)

{
  QString *pQVar1;
  bool bVar2;
  QString *pQVar3;
  QString *pQVar4;
  long in_FS_OFFSET;
  QStringView pattern;
  QRegularExpression rx;
  QRegularExpressionMatch local_48;
  Data *local_40;
  char16_t *local_38;
  
  local_38 = *(char16_t **)(in_FS_OFFSET + 0x28);
  pQVar1 = (filters->d).ptr;
  do {
    pQVar3 = pQVar1;
    pQVar4 = (filters->d).ptr + (filters->d).size;
    if (pQVar3 == pQVar4) break;
    local_40 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pattern.m_data = (storage_type_conflict *)(pQVar3->d).size;
    pattern.m_size = (qsizetype)&local_40;
    QRegularExpression::fromWildcard
              (pattern,(CaseSensitivity)(pQVar3->d).ptr,(WildcardConversionOptions)0x0);
    QRegularExpression::match
              ((QRegularExpression *)&local_48,(QString *)&local_40,(qsizetype)fileName,NormalMatch,
               (MatchOptions)0x0);
    bVar2 = QRegularExpressionMatch::hasMatch(&local_48);
    QRegularExpressionMatch::~QRegularExpressionMatch(&local_48);
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_40);
    pQVar1 = pQVar3 + 1;
  } while (!bVar2);
  if (*(char16_t **)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3 != pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::match(const QStringList &filters, const QString &fileName)
{
    for (QStringList::ConstIterator sit = filters.constBegin(); sit != filters.constEnd(); ++sit) {
        // Insensitive exact match
        auto rx = QRegularExpression::fromWildcard(*sit, Qt::CaseInsensitive);
        if (rx.match(fileName).hasMatch())
            return true;
    }
    return false;
}